

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O2

void ON_DimStyle::Internal_CreateFromProperties
               (ON_DimStyle *parent_dim_style,AnnotationType annotation_type,ON_Font *font,
               double model_space_text_scale,double text_height,
               LengthUnitSystem text_height_unit_system,bool bSetAlignment,
               TextVerticalAlignment valign,TextHorizontalAlignment halign,bool bSetOrientation,
               TextOrientation orientation,bool bSetLocation,TextLocation location,
               ON_DimStyle *destination)

{
  LengthUnitSystem LVar1;
  TextOrientation TVar2;
  LengthUnitSystem u1;
  int iVar3;
  uint uVar4;
  ON_Font *rhs;
  byte bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  double dVar9;
  
  if (font != (ON_Font *)0x0) {
    rhs = parent_dim_style->m_managed_font;
    if (rhs == (ON_Font *)0x0) {
      rhs = &ON_Font::Default;
    }
    iVar3 = ON_Font::CompareFontCharacteristics(font,rhs);
    if (iVar3 != 0) {
      SetFont(destination,font);
    }
  }
  if (0.0 < model_space_text_scale) {
    dVar9 = ON_ScaleValue::RightToLeftScale(&parent_dim_style->m_scale_value);
    if (model_space_text_scale * 0.001 < ABS(model_space_text_scale - dVar9)) {
      SetDimScale(destination,model_space_text_scale);
    }
  }
  if (0.0 < text_height) {
    LVar1 = parent_dim_style->m_dimstyle_unitsystem;
    u1 = None;
    if ((LVar1 != CustomUnits) && (LVar1 != Unset)) {
      u1 = LVar1;
    }
    dVar9 = ON::UnitScale(text_height_unit_system,u1);
    dVar9 = dVar9 * text_height;
    if ((0.0 < dVar9) && (dVar9 * 0.001 < ABS(dVar9 - parent_dim_style->m_textheight))) {
      SetTextHeight(destination,dVar9);
    }
  }
  uVar4 = (uint)annotation_type;
  if (bSetAlignment) {
    if ((annotation_type == Text) || (uVar4 == 0)) {
      bVar6 = parent_dim_style->m_text_horizontal_alignment != halign;
    }
    else {
      bVar6 = false;
    }
    if ((annotation_type == Leader) || (uVar4 == 0)) {
      bVar7 = parent_dim_style->m_leader_text_horizontal_alignment != halign;
    }
    else {
      bVar7 = false;
    }
    if (bVar6) {
      SetTextHorizontalAlignment(destination,halign);
    }
    if (bVar7) {
      SetLeaderTextHorizontalAlignment(destination,halign);
    }
    if ((annotation_type == Text) || (uVar4 == 0)) {
      bVar6 = parent_dim_style->m_text_vertical_alignment != valign;
    }
    else {
      bVar6 = false;
    }
    if ((annotation_type == Leader) || (uVar4 == 0)) {
      bVar7 = parent_dim_style->m_leader_text_vertical_alignment != valign;
    }
    else {
      bVar7 = false;
    }
    if (bVar6) {
      SetTextVerticalAlignment(destination,valign);
    }
    if (bVar7) {
      SetLeaderTextVerticalAlignment(destination,valign);
    }
  }
  bVar5 = annotation_type < (CenterMark|Radius) & (byte)(0x867 >> (annotation_type & 0x1f));
  if (bSetOrientation) {
    if ((annotation_type == Text) || (uVar4 == 0)) {
      bVar6 = parent_dim_style->m_text_orientation != orientation;
    }
    else {
      bVar6 = false;
    }
    if ((annotation_type == Leader) || (uVar4 == 0)) {
      bVar7 = parent_dim_style->m_leader_text_orientation != orientation;
    }
    else {
      bVar7 = false;
    }
    TVar2 = parent_dim_style->m_dim_text_orientation;
    bVar8 = false;
    if ((annotation_type < Rotated) && (bVar8 = false, (0x19U >> (uVar4 & 0x1f) & 1) != 0)) {
      bVar8 = parent_dim_style->m_dimradial_text_orientation != orientation;
    }
    if (bVar6) {
      SetTextOrientation(destination,orientation);
    }
    if (bVar7) {
      SetLeaderTextOrientation(destination,orientation);
    }
    if ((TVar2 != orientation & bVar5) != 0) {
      SetDimTextOrientation(destination,orientation);
    }
    if (bVar8) {
      SetDimRadialTextOrientation(destination,orientation);
    }
  }
  if (bSetLocation) {
    bVar6 = false;
    if ((annotation_type < Rotated) && ((0x19U >> (uVar4 & 0x1f) & 1) != 0)) {
      bVar6 = parent_dim_style->m_dimradial_text_location != location;
    }
    if ((bVar5 & parent_dim_style->m_dim_text_location != location) != 0) {
      SetDimTextLocation(destination,location);
    }
    if (bVar6) {
      SetDimRadialTextLocation(destination,location);
      return;
    }
  }
  return;
}

Assistant:

void ON_DimStyle::Internal_CreateFromProperties(
  const ON_DimStyle& parent_dim_style,
  ON::AnnotationType annotation_type,
  const ON_Font* font,
  double model_space_text_scale,
  double text_height,
  ON::LengthUnitSystem text_height_unit_system,
  bool bSetAlignment,
  ON::TextVerticalAlignment valign,
  ON::TextHorizontalAlignment halign,
  bool bSetOrientation,
  ON::TextOrientation orientation,
  bool bSetLocation,
  ON_DimStyle::TextLocation location,
  ON_DimStyle& destination
)
{
  if (nullptr != font)
  {
    if (0 != ON_Font::CompareFontCharacteristics(*font, parent_dim_style.Font()))
      destination.SetFont(*font);
  }

  if (model_space_text_scale > 0.0)
  {
    if (fabs(model_space_text_scale - parent_dim_style.DimScale()) > 0.001*model_space_text_scale )
      destination.SetDimScale(model_space_text_scale);
  }

  if (text_height > 0.0)
  {
    double x = ON::UnitScale(text_height_unit_system, parent_dim_style.UnitSystem())*text_height;
    if (x > 0.0 && fabs(x - parent_dim_style.TextHeight()) > 0.001*x )
      destination.SetTextHeight(x);
  }

  /////////////////////////////////////////////////
  //
  // Use annotation_type parameter to determine what annotation types are effected by the settings
  //
  const bool bAllAnnotationTypes = (ON::AnnotationType::Unset == annotation_type);
  const bool bDimLinearType 
    = ON::AnnotationType::Aligned == annotation_type 
    || ON::AnnotationType::Rotated == annotation_type
    ;
  const bool bDimAngularType 
    = ON::AnnotationType::Angular == annotation_type
    || ON::AnnotationType::Angular3pt == annotation_type
    ;
  const bool bDimRadialType 
    = ON::AnnotationType::Radius == annotation_type
    || ON::AnnotationType::Diameter == annotation_type
    ;

  const bool bSetTextProps 
    = (bAllAnnotationTypes || ON::AnnotationType::Text == annotation_type);

  const bool bSetLeaderProps
    = (bAllAnnotationTypes || ON::AnnotationType::Leader == annotation_type);

  const bool bSetDimProps
    = (bAllAnnotationTypes || bDimLinearType || bDimAngularType || ON::AnnotationType::Ordinate == annotation_type);

  const bool bSetDimRadialProps
    = (bAllAnnotationTypes || bDimRadialType);

  /////////////////////////////////////////////////
  //
  // Override type specific properties as needed
  //
  if (bSetAlignment)
  {
    const bool bOverrideTextHAlign = bSetTextProps && halign != parent_dim_style.TextHorizontalAlignment();
    const bool bOverrideLeaderHAlign = bSetLeaderProps && halign != parent_dim_style.LeaderTextHorizontalAlignment();
    if (bOverrideTextHAlign)
      destination.SetTextHorizontalAlignment(halign);
    if (bOverrideLeaderHAlign)
      destination.SetLeaderTextHorizontalAlignment(halign);

    const bool bOverrideTextVAlign = bSetTextProps && valign != parent_dim_style.TextVerticalAlignment();
    const bool bOverrideLeaderVAlign = bSetLeaderProps && valign != parent_dim_style.LeaderTextVerticalAlignment();
    if (bOverrideTextVAlign)
      destination.SetTextVerticalAlignment(valign);
    if (bOverrideLeaderVAlign)
      destination.SetLeaderTextVerticalAlignment(valign);
  }
  
  if (bSetOrientation)
  {
    const bool bOverrideTextOrientation = bSetTextProps && orientation != parent_dim_style.TextOrientation();
    const bool bOverrideLeaderOrientation = bSetLeaderProps && orientation != parent_dim_style.LeaderTextOrientation();
    const bool bOverrideDimOrientation = bSetDimProps && orientation != parent_dim_style.DimTextOrientation();
    const bool bOverrideDimRadialOrientation = bSetDimRadialProps && orientation != parent_dim_style.DimRadialTextOrientation();
    if (bOverrideTextOrientation)
      destination.SetTextOrientation(orientation);
    if (bOverrideLeaderOrientation)
      destination.SetLeaderTextOrientation(orientation);
    if (bOverrideDimOrientation)
      destination.SetDimTextOrientation(orientation);
    if (bOverrideDimRadialOrientation)
      destination.SetDimRadialTextOrientation(orientation);
  }

  if (bSetLocation)
  {
    const bool bOverrideDimTextLocation = bSetDimProps && location != parent_dim_style.DimTextLocation();
    const bool bOverrideDimRadialTextLocation = bSetDimRadialProps && location != parent_dim_style.DimRadialTextLocation();
    if (bOverrideDimTextLocation)
      destination.SetDimTextLocation(location);
    if (bOverrideDimRadialTextLocation)
      destination.SetDimRadialTextLocation(location);
  }
}